

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

ON_XMLVariant * __thiscall
ON_RenderContent::GetParameter
          (ON_XMLVariant *__return_storage_ptr__,ON_RenderContent *this,wchar_t *name)

{
  ON_XMLNode *pOVar1;
  undefined1 local_68 [8];
  ON_XMLParameters p_1;
  ON_XMLParametersV8 p;
  ON_XMLNode *node;
  lock_guard<std::recursive_mutex> local_28;
  lock_guard<std::recursive_mutex> lg;
  wchar_t *name_local;
  ON_RenderContent *this_local;
  ON_XMLVariant *value;
  
  lg._M_device = (mutex_type *)name;
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_28,&this->_private->m_mutex);
  ::ON_XMLVariant::ON_XMLVariant(__return_storage_ptr__);
  ::ON_XMLVariant::SetNull(__return_storage_ptr__);
  pOVar1 = ON_XMLNode::GetNamedChild(&this->_private->m_node,L"parameters-v8");
  if (pOVar1 == (ON_XMLNode *)0x0) {
    pOVar1 = ON_XMLNode::GetNamedChild(&this->_private->m_node,L"parameters");
    if (pOVar1 != (ON_XMLNode *)0x0) {
      ON_XMLParameters::ON_XMLParameters((ON_XMLParameters *)local_68,pOVar1);
      ON_XMLParameters::GetParam
                ((ON_XMLParameters *)local_68,(wchar_t *)lg._M_device,__return_storage_ptr__);
      ON_XMLParameters::~ON_XMLParameters((ON_XMLParameters *)local_68);
    }
  }
  else {
    ON_XMLParametersV8::ON_XMLParametersV8((ON_XMLParametersV8 *)&p_1._private,pOVar1);
    ON_XMLParametersV8::GetParam
              ((ON_XMLParametersV8 *)&p_1._private,(wchar_t *)lg._M_device,__return_storage_ptr__);
    ON_XMLParametersV8::~ON_XMLParametersV8((ON_XMLParametersV8 *)&p_1._private);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_28);
  return __return_storage_ptr__;
}

Assistant:

ON_XMLVariant ON_RenderContent::GetParameter(const wchar_t* name) const
{
  std::lock_guard<std::recursive_mutex> lg(_private->m_mutex);

  ON_XMLVariant value;
  value.SetNull();

  // Try to get the new V8 parameter section.
  const ON_XMLNode* node = _private->m_node.GetNamedChild(ON_RENDER_CONTENT_PARAMETERS_V8);
  if (nullptr != node)
  {
    // Got it, so use the new ON_XMLParametersV8 to get the parameter's value.
    ON_XMLParametersV8 p(*node);
    p.GetParam(name, value);
  }
  else
  {
    // Either no V8 section was found or the parameter isn't there yet.
    // Try to get the legacy parameter section. This should not fail.
    node = _private->m_node.GetNamedChild(ON_RENDER_CONTENT_PARAMETERS);
    if (nullptr != node)
    {
      // Got it, so use the legacy ON_XMLParameters to get the parameter's value.
      ON_XMLParameters p(*node);
      p.GetParam(name, value);
    }
  }

  return value;
}